

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zutil.c
# Opt level: O3

void zcheck_tempv(int n,doublecomplex *tempv)

{
  double *pdVar1;
  ulong uVar2;
  char msg [256];
  char acStack_138 [264];
  
  if (0 < n) {
    pdVar1 = &tempv->i;
    uVar2 = 0;
    do {
      if ((((((doublecomplex *)(pdVar1 + -1))->r != 0.0) ||
           (NAN(((doublecomplex *)(pdVar1 + -1))->r))) || (*pdVar1 != 0.0)) || (NAN(*pdVar1))) {
        fprintf(_stderr,"tempv[%d] = {%f, %f}\n",uVar2 & 0xffffffff);
        sprintf(acStack_138,"%s at line %d in file %s\n","zcheck_tempv",0x15c,
                "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zutil.c");
        superlu_abort_and_exit(acStack_138);
      }
      uVar2 = uVar2 + 1;
      pdVar1 = pdVar1 + 2;
    } while ((uint)n != uVar2);
  }
  return;
}

Assistant:

void zcheck_tempv(int n, doublecomplex *tempv)
{
    int i;
	
    for (i = 0; i < n; i++) {
	if ((tempv[i].r != 0.0) || (tempv[i].i != 0.0))
	{
	    fprintf(stderr,"tempv[%d] = {%f, %f}\n", i, tempv[i].r, tempv[i].i);
	    ABORT("zcheck_tempv");
	}
    }
}